

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_stream(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  size_t *conn;
  st_quicly_sent_block_t *stream_id;
  long lVar1;
  uint64_t uVar2;
  int iVar3;
  quicly_stream_t *stream;
  
  conn = &map[-0x28].num_packets;
  if (acked == 0) {
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar3 = ptls_skip_tracing((ptls_t *)map[0x10].head), iVar3 == 0)) {
      lVar1 = (sent->data).packet.sent_at;
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"stream-lost\", \"conn\":%u, \"time\":%lld, \"stream-id\":%lld, \"off\":%llu, \"len\":%llu}\n"
              ,(ulong)*(uint *)&map[-0x28]._pending_packet,map[0x16]._pending_packet,
              (sent->data).packet.packet_number,lVar1,(sent->data).stream.args.end - lVar1);
    }
    stream = quicly_get_stream((quicly_conn_t *)conn,(sent->data).stream.stream_id);
    if (stream != (quicly_stream_t *)0x0) {
      iVar3 = quicly_sendstate_lost(&stream->sendstate,&(sent->data).stream.args);
      if (iVar3 != 0) {
        return iVar3;
      }
      if ((stream->_send_aux).reset_stream.sender_state == QUICLY_SENDER_STATE_NONE) {
        resched_stream_data(stream);
      }
    }
  }
  else {
    if ((quicly_trace_fp != (FILE *)0x0) &&
       (iVar3 = ptls_skip_tracing((ptls_t *)map[0x10].head), iVar3 == 0)) {
      lVar1 = (sent->data).packet.sent_at;
      fprintf((FILE *)quicly_trace_fp,
              "{\"type\":\"stream-acked\", \"conn\":%u, \"time\":%lld, \"stream-id\":%lld, \"off\":%llu, \"len\":%llu}\n"
              ,(ulong)*(uint *)&map[-0x28]._pending_packet,map[0x16]._pending_packet,
              (sent->data).packet.packet_number,lVar1,(sent->data).stream.args.end - lVar1);
    }
    if ((((packet->field_0x11 & 2) == 0) ||
        (map[0x17].tail != (st_quicly_sent_block_t *)(sent->data).packet.packet_number)) ||
       (map[0x17].bytes_in_flight != (sent->data).packet.sent_at)) {
      iVar3 = on_ack_stream_ack_cached((quicly_conn_t *)conn);
      if (iVar3 != 0) {
        return iVar3;
      }
      stream_id = (st_quicly_sent_block_t *)(sent->data).stream.stream_id;
      if ((packet->field_0x11 & 2) == 0) {
        iVar3 = on_ack_stream_ack_one
                          ((quicly_conn_t *)conn,(quicly_stream_id_t)stream_id,
                           &(sent->data).stream.args);
        if (iVar3 != 0) {
          return iVar3;
        }
      }
      else {
        map[0x17].tail = stream_id;
        uVar2 = (sent->data).stream.args.end;
        map[0x17].num_packets = (sent->data).packet.sent_at;
        map[0x17].bytes_in_flight = uVar2;
      }
    }
    else {
      map[0x17].bytes_in_flight = (sent->data).stream.args.end;
    }
  }
  return 0;
}

Assistant:

static int on_ack_stream(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    int ret;

    if (acked) {

        QUICLY_PROBE(STREAM_ACKED, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        if (packet->frames_in_flight && conn->stash.on_ack_stream.active_acked_cache.stream_id == sent->data.stream.stream_id &&
            conn->stash.on_ack_stream.active_acked_cache.args.end == sent->data.stream.args.start) {
            /* Fast path: append the newly supplied range to the existing cached range. */
            conn->stash.on_ack_stream.active_acked_cache.args.end = sent->data.stream.args.end;
        } else {
            /* Slow path: submit the cached range, and if possible, cache the newly supplied range. Else submit the newly supplied
             * range directly. */
            if ((ret = on_ack_stream_ack_cached(conn)) != 0)
                return ret;
            if (packet->frames_in_flight) {
                conn->stash.on_ack_stream.active_acked_cache.stream_id = sent->data.stream.stream_id;
                conn->stash.on_ack_stream.active_acked_cache.args = sent->data.stream.args;
            } else {
                if ((ret = on_ack_stream_ack_one(conn, sent->data.stream.stream_id, &sent->data.stream.args)) != 0)
                    return ret;
            }
        }

    } else {

        QUICLY_PROBE(STREAM_LOST, conn, conn->stash.now, sent->data.stream.stream_id, sent->data.stream.args.start,
                     sent->data.stream.args.end - sent->data.stream.args.start);

        quicly_stream_t *stream;
        if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) == NULL)
            return 0;
        /* FIXME handle rto error */
        if ((ret = quicly_sendstate_lost(&stream->sendstate, &sent->data.stream.args)) != 0)
            return ret;
        if (stream->_send_aux.reset_stream.sender_state == QUICLY_SENDER_STATE_NONE)
            resched_stream_data(stream);
    }

    return 0;
}